

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall
asmjit::v1_14::Zone::_init(Zone *this,size_t blockSize,size_t blockAlignment,Temporary *temporary)

{
  Block *block;
  long lVar1;
  long lVar2;
  int line;
  char *msg;
  Zone ZVar3;
  
  if (blockSize < 0x100) {
    msg = "blockSize >= kMinBlockSize";
    line = 0x25;
  }
  else if (blockSize < 0x8000000000000001) {
    if (blockAlignment < 0x41) {
      *(char **)this =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(char **)(this + 8) =
           "/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
      ;
      *(undefined1 **)(this + 0x10) = _zeroBlock;
      lVar1 = 0x3f;
      if (blockSize != 0) {
        for (; blockSize >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      lVar2 = 0x3f;
      if ((blockAlignment | 8) != 0) {
        for (; (blockAlignment | 8) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      this[0x18] = (Zone)('@' - ((byte)lVar2 ^ 0x3f));
      this[0x19] = (Zone)('@' - ((byte)lVar1 ^ 0x3f));
      this[0x1a] = (Zone)0x19;
      *(undefined4 *)(this + 0x1c) = 0;
      ZVar3 = (Zone)(temporary != (Temporary *)0x0);
      this[0x1b] = ZVar3;
      *(ulong *)(this + 0x20) = (ulong)(byte)ZVar3;
      if ((bool)ZVar3) {
        block = (Block *)temporary->_data;
        block->prev = (Block *)0x0;
        block->next = (Block *)0x0;
        if (temporary->_size < 0x18) {
          msg = "temporary->size() >= kBlockSize";
          line = 0x3b;
          goto LAB_00126b6f;
        }
        block->size = temporary->_size - 0x18;
        Zone_assignBlock(this,block);
        *(undefined8 *)(this + 0x20) = 1;
      }
      return;
    }
    msg = "blockAlignment <= 64";
    line = 0x27;
  }
  else {
    msg = "blockSize <= kMaxBlockSize";
    line = 0x26;
  }
LAB_00126b6f:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zone.cpp"
             ,line,msg);
}

Assistant:

void Zone::_init(size_t blockSize, size_t blockAlignment, const Support::Temporary* temporary) noexcept {
  ASMJIT_ASSERT(blockSize >= kMinBlockSize);
  ASMJIT_ASSERT(blockSize <= kMaxBlockSize);
  ASMJIT_ASSERT(blockAlignment <= 64);

  Zone_assignZeroBlock(this);

  size_t blockSizeShift = Support::bitSizeOf<size_t>() - Support::clz(blockSize);
  size_t blockAlignmentShift = Support::bitSizeOf<size_t>() - Support::clz(blockAlignment | (size_t(1) << 3));

  _blockAlignmentShift = uint8_t(blockAlignmentShift);
  _minimumBlockSizeShift = uint8_t(blockSizeShift);
  _maximumBlockSizeShift = uint8_t(25); // (1 << 25) Equals 32 MiB blocks (should be enough for all cases)
  _hasStaticBlock = uint8_t(temporary != nullptr);
  _reserved = uint8_t(0u);
  _blockCount = size_t(temporary != nullptr);

  // Setup the first [temporary] block, if necessary.
  if (temporary) {
    Block* block = temporary->data<Block>();
    block->prev = nullptr;
    block->next = nullptr;

    ASMJIT_ASSERT(temporary->size() >= kBlockSize);
    block->size = temporary->size() - kBlockSize;

    Zone_assignBlock(this, block);
    _blockCount = 1u;
  }
}